

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void sync_c0_status_mips(CPUMIPSState *env,CPUMIPSState *cpu,int tc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  TCState *pTVar4;
  uint32_t mask;
  uint32_t ksu;
  uint32_t asid;
  uint32_t mx;
  uint32_t cu;
  uint32_t v;
  int32_t *tcst;
  int32_t tcstatus;
  int tc_local;
  CPUMIPSState *cpu_local;
  CPUMIPSState *env_local;
  
  uVar1 = cpu->CP0_Status;
  uVar2 = env->CP0_EntryHi;
  uVar3 = env->CP0_EntryHi_ASID_mask;
  if (tc == cpu->current_tc) {
    pTVar4 = &cpu->active_tc;
  }
  else {
    pTVar4 = cpu->tcs + tc;
  }
  _cu = &pTVar4->CP0_TCStatus;
  *_cu = *_cu & 0x7ffe700;
  *_cu = uVar2 & uVar3 | (uVar1 >> 3 & 3) << 0xb | (uVar1 >> 0x18 & 1) << 0x1b | uVar1 & 0xf0000000
         | *_cu;
  compute_hflags(cpu);
  return;
}

Assistant:

void sync_c0_status(CPUMIPSState *env, CPUMIPSState *cpu, int tc)
{
    int32_t tcstatus, *tcst;
    uint32_t v = cpu->CP0_Status;
    uint32_t cu, mx, asid, ksu;
    uint32_t mask = ((1 << CP0TCSt_TCU3)
                       | (1 << CP0TCSt_TCU2)
                       | (1 << CP0TCSt_TCU1)
                       | (1 << CP0TCSt_TCU0)
                       | (1 << CP0TCSt_TMX)
                       | (3 << CP0TCSt_TKSU)
                       | (0xff << CP0TCSt_TASID));

    cu = (v >> CP0St_CU0) & 0xf;
    mx = (v >> CP0St_MX) & 0x1;
    ksu = (v >> CP0St_KSU) & 0x3;
    asid = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;

    tcstatus = cu << CP0TCSt_TCU0;
    tcstatus |= mx << CP0TCSt_TMX;
    tcstatus |= ksu << CP0TCSt_TKSU;
    tcstatus |= asid;

    if (tc == cpu->current_tc) {
        tcst = &cpu->active_tc.CP0_TCStatus;
    } else {
        tcst = &cpu->tcs[tc].CP0_TCStatus;
    }

    *tcst &= ~mask;
    *tcst |= tcstatus;
    compute_hflags(cpu);
}